

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_scope.c
# Opt level: O1

l2_scope * l2_scope_create(void)

{
  l2_scope *plVar1;
  l2_symbol_node *plVar2;
  
  plVar1 = (l2_scope *)l2_storage_mem_new_with_zero(g_parser_p->storage_p,0x38);
  plVar1->guid = plVar1;
  plVar1->level = 0;
  plVar1->upper_p = (_l2_scope *)0x0;
  plVar1->lower_p = (_l2_scope *)0x0;
  plVar2 = l2_symbol_table_create();
  plVar1->symbol_table_p = plVar2;
  return plVar1;
}

Assistant:

l2_scope *l2_scope_create() {
    l2_scope *global_p;
    global_p = l2_storage_mem_new_with_zero(g_parser_p->storage_p, sizeof(l2_scope));
    global_p->guid = global_p;
    global_p->level = 0;
    global_p->upper_p = L2_NULL_PTR;
    global_p->lower_p = L2_NULL_PTR;
    global_p->symbol_table_p = l2_symbol_table_create();
    return global_p;
}